

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O1

void anon_unknown.dwarf_8beaa::invertM33f(M33f *m,float e)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  long lVar8;
  float *pfVar9;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Matrix33<float> tmp_1;
  Matrix33<float> tmp;
  M33f inv2;
  M33f inv1;
  float local_b8 [7];
  float fStack_9c;
  float local_98;
  float local_88 [7];
  float fStack_6c;
  float local_68;
  Matrix33<float> local_60;
  Matrix33<float> local_3c;
  
  Imath_3_2::Matrix33<float>::inverse(&local_3c,m);
  Imath_3_2::Matrix33<float>::gjInverse(&local_60,m);
  fVar21 = local_3c.x[1][1];
  fVar22 = local_3c.x[1][2];
  fVar2 = m->x[1][1];
  fVar14 = (float)*(undefined8 *)(m->x[0] + 1);
  fVar3 = m->x[1][0];
  fVar15 = (float)*(undefined8 *)m->x[0];
  fVar16 = local_3c.x[0][1];
  fVar17 = local_3c.x[0][2];
  fVar4 = m->x[1][2];
  fVar20 = (float)*(undefined8 *)(m->x[0] + 2);
  fVar18 = local_3c.x[2][1];
  fVar19 = local_3c.x[2][2];
  local_88[0] = local_3c.x[2][0] * fVar20 + local_3c.x[0][0] * fVar15 + local_3c.x[1][0] * fVar14;
  local_88[1] = fVar18 * fVar20 + fVar16 * fVar15 + fVar21 * fVar14;
  local_88[2] = fVar19 * fVar20 + fVar17 * fVar15 + fVar22 * fVar14;
  local_88[3] = local_3c.x[2][0] * fVar4 + local_3c.x[0][0] * fVar3 + local_3c.x[1][0] * fVar2;
  fVar5 = m->x[2][0];
  fVar6 = m->x[2][1];
  fVar7 = m->x[2][2];
  local_88[4] = fVar18 * fVar4 + fVar16 * fVar3 + fVar21 * fVar2;
  local_88[5] = fVar19 * fVar4 + fVar17 * fVar3 + fVar22 * fVar2;
  local_88[6] = local_3c.x[2][0] * fVar7 + local_3c.x[0][0] * fVar5 + local_3c.x[1][0] * fVar6;
  fStack_6c = fVar18 * fVar7 + fVar16 * fVar5 + fVar21 * fVar6;
  local_68 = fVar19 * fVar7 + fVar17 * fVar5 + fVar22 * fVar6;
  fVar21 = local_60.x[1][1];
  fVar22 = local_60.x[1][2];
  fVar16 = local_60.x[0][1];
  fVar17 = local_60.x[0][2];
  fVar18 = local_60.x[2][1];
  fVar19 = local_60.x[2][2];
  local_b8[0] = local_60.x[2][0] * fVar20 + local_60.x[0][0] * fVar15 + local_60.x[1][0] * fVar14;
  local_b8[1] = fVar18 * fVar20 + fVar16 * fVar15 + fVar21 * fVar14;
  local_b8[2] = fVar19 * fVar20 + fVar17 * fVar15 + fVar22 * fVar14;
  local_b8[3] = local_60.x[2][0] * fVar4 + local_60.x[0][0] * fVar3 + local_60.x[1][0] * fVar2;
  local_b8[4] = fVar18 * fVar4 + fVar16 * fVar3 + fVar21 * fVar2;
  local_b8[5] = fVar19 * fVar4 + fVar17 * fVar3 + fVar22 * fVar2;
  local_b8[6] = local_60.x[2][0] * fVar7 + local_60.x[0][0] * fVar5 + local_60.x[1][0] * fVar6;
  fStack_9c = fVar18 * fVar7 + fVar16 * fVar5 + fVar21 * fVar6;
  local_98 = fVar19 * fVar7 + fVar17 * fVar5 + fVar22 * fVar6;
  if ((float)(~-(uint)((float)Imath_3_2::identity33f < local_88[0]) &
              (uint)((float)Imath_3_2::identity33f - local_88[0]) |
             (uint)(local_88[0] - (float)Imath_3_2::identity33f) &
             -(uint)((float)Imath_3_2::identity33f < local_88[0])) <= e) {
    pfVar9 = local_88;
    bVar13 = false;
    puVar10 = &Imath_3_2::identity33f;
    uVar11 = 0;
    do {
      lVar8 = 1;
      do {
        lVar12 = lVar8;
        if (lVar12 == 3) goto LAB_0013c803;
        fVar2 = pfVar9[lVar12];
        fVar3 = *(float *)((long)puVar10 + lVar12 * 4);
        lVar8 = lVar12 + 1;
      } while ((float)(~-(uint)(fVar3 < fVar2) & (uint)(fVar3 - fVar2) |
                      (uint)(fVar2 - fVar3) & -(uint)(fVar3 < fVar2)) <= e);
      if (lVar12 - 1U < 2) break;
LAB_0013c803:
      uVar1 = uVar11 + 1;
      bVar13 = 1 < uVar11;
      if (uVar1 == 3) break;
      fVar2 = local_88[uVar1 * 3];
      fVar3 = *(float *)((long)&Imath_3_2::identity33f + uVar1 * 0xc);
      pfVar9 = pfVar9 + 3;
      puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      uVar11 = uVar1;
    } while ((float)(~-(uint)(fVar3 < fVar2) & (uint)(fVar3 - fVar2) |
                    (uint)(fVar2 - fVar3) & -(uint)(fVar3 < fVar2)) <= e);
    if (bVar13) {
      if ((float)(~-(uint)((float)Imath_3_2::identity33f < local_b8[0]) &
                  (uint)((float)Imath_3_2::identity33f - local_b8[0]) |
                 (uint)(local_b8[0] - (float)Imath_3_2::identity33f) &
                 -(uint)((float)Imath_3_2::identity33f < local_b8[0])) <= e) {
        pfVar9 = local_b8;
        bVar13 = false;
        puVar10 = &Imath_3_2::identity33f;
        uVar11 = 0;
        do {
          lVar8 = 1;
          do {
            lVar12 = lVar8;
            if (lVar12 == 3) goto LAB_0013c8ed;
            fVar2 = pfVar9[lVar12];
            fVar3 = *(float *)((long)puVar10 + lVar12 * 4);
            lVar8 = lVar12 + 1;
          } while ((float)(~-(uint)(fVar3 < fVar2) & (uint)(fVar3 - fVar2) |
                          (uint)(fVar2 - fVar3) & -(uint)(fVar3 < fVar2)) <= e);
          if (lVar12 - 1U < 2) break;
LAB_0013c8ed:
          uVar1 = uVar11 + 1;
          bVar13 = 1 < uVar11;
          if (uVar1 == 3) break;
          fVar2 = local_b8[uVar1 * 3];
          fVar3 = *(float *)((long)&Imath_3_2::identity33f + uVar1 * 0xc);
          pfVar9 = pfVar9 + 3;
          puVar10 = (undefined8 *)((long)puVar10 + 0xc);
          uVar11 = uVar1;
        } while ((float)(~-(uint)(fVar3 < fVar2) & (uint)(fVar3 - fVar2) |
                        (uint)(fVar2 - fVar3) & -(uint)(fVar3 < fVar2)) <= e);
        if (bVar13) {
          return;
        }
      }
      __assert_fail("ident2.equalWithAbsError (identity33f, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                    ,0x33,"void (anonymous namespace)::invertM33f(const M33f &, float)");
    }
  }
  __assert_fail("ident1.equalWithAbsError (identity33f, e)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                ,0x32,"void (anonymous namespace)::invertM33f(const M33f &, float)");
}

Assistant:

void
invertM33f (const M33f& m, float e)
{
    M33f inv1   = m.inverse ();
    M33f inv2   = m.gjInverse ();
    M33f ident1 = m * inv1;
    M33f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity33f, e));
    assert (ident2.equalWithAbsError (identity33f, e));
}